

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O0

void dispatch_notification(int pi,gpioReport_t *r)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long in_RSI;
  uint in_EDI;
  int g;
  int l;
  uint32_t changed;
  evtCallback_t *ep;
  callback_t *p;
  uint local_28;
  evtCallback_t *local_20;
  callback_t *local_18;
  
  if (*(short *)(in_RSI + 2) == 0) {
    uVar3 = *(uint *)(in_RSI + 8);
    uVar1 = gLastLevel[(int)in_EDI];
    uVar2 = gNotifyBits[(int)in_EDI];
    gLastLevel[(int)in_EDI] = *(uint32_t *)(in_RSI + 8);
    for (local_18 = gCallBackFirst; local_18 != (callback_t *)0x0; local_18 = local_18->next) {
      if (((local_18->pi == in_EDI) &&
          (((uVar3 ^ uVar1) & uVar2 & 1 << ((byte)local_18->gpio & 0x1f)) != 0)) &&
         (local_28 = (uint)((*(uint *)(in_RSI + 8) & 1 << ((byte)local_18->gpio & 0x1f)) != 0),
         local_18->edge != local_28)) {
        if (local_18->ex == 0) {
          (*local_18->f)((ulong)in_EDI,(ulong)(uint)local_18->gpio,(ulong)local_28,
                         (ulong)*(uint *)(in_RSI + 4));
        }
        else {
          (*local_18->f)((ulong)in_EDI,(ulong)(uint)local_18->gpio,(ulong)local_28,
                         (ulong)*(uint *)(in_RSI + 4),local_18->user);
        }
      }
    }
  }
  else if ((*(ushort *)(in_RSI + 2) & 0x20) == 0) {
    if ((*(ushort *)(in_RSI + 2) & 0x80) != 0) {
      uVar3 = *(ushort *)(in_RSI + 2) & 0x1f;
      for (local_20 = geCallBackFirst; local_20 != (evtCallback_t *)0x0; local_20 = local_20->next)
      {
        if ((local_20->pi == in_EDI) && (local_20->event == uVar3)) {
          if (local_20->ex == 0) {
            (*local_20->f)((ulong)in_EDI,(ulong)uVar3,(ulong)*(uint *)(in_RSI + 4));
          }
          else {
            (*local_20->f)((ulong)in_EDI,(ulong)uVar3,(ulong)*(uint *)(in_RSI + 4),local_20->user);
          }
        }
      }
    }
  }
  else {
    uVar3 = *(ushort *)(in_RSI + 2) & 0x1f;
    for (local_18 = gCallBackFirst; local_18 != (callback_t *)0x0; local_18 = local_18->next) {
      if ((local_18->pi == in_EDI) && (local_18->gpio == uVar3)) {
        if (local_18->ex == 0) {
          (*local_18->f)((ulong)in_EDI,(ulong)uVar3,2,(ulong)*(uint *)(in_RSI + 4));
        }
        else {
          (*local_18->f)((ulong)in_EDI,(ulong)uVar3,2,(ulong)*(uint *)(in_RSI + 4),local_18->user);
        }
      }
    }
  }
  return;
}

Assistant:

static void dispatch_notification(int pi, gpioReport_t *r)
{
   callback_t *p;
   evtCallback_t *ep;
   uint32_t changed;
   int l, g;

/*
   printf("s=%4x f=%4x t=%10u l=%8x\n",
      r->seqno, r->flags, r->tick, r->level);
*/

   if (r->flags == 0)
   {
      changed = (r->level ^ gLastLevel[pi]) & gNotifyBits[pi];

      gLastLevel[pi] = r->level;

      p = gCallBackFirst;

      while (p)
      {
         if (((p->pi) == pi) && (changed & (1<<(p->gpio))))
         {
            if ((r->level) & (1<<(p->gpio))) l = 1; else l = 0;
            if ((p->edge) ^ l)
            {
               if (p->ex) (p->f)(pi, p->gpio, l, r->tick, p->user);
               else       (p->f)(pi, p->gpio, l, r->tick);
            }
         }
         p = p->next;
      }
   }
   else
   {
      if ((r->flags) & PI_NTFY_FLAGS_WDOG)
      {
         g = (r->flags) & 31;

         p = gCallBackFirst;

         while (p)
         {
            if (((p->pi) == pi) && ((p->gpio) == g))
            {
               if (p->ex) (p->f)(pi, g, PI_TIMEOUT, r->tick, p->user);
               else       (p->f)(pi, g, PI_TIMEOUT, r->tick);
            }
            p = p->next;
         }
      }
      else if ((r->flags) & PI_NTFY_FLAGS_EVENT)
      {
         g = (r->flags) & 31;

         ep = geCallBackFirst;

         while (ep)
         {
            if (((ep->pi) == pi) && ((ep->event) == g))
            {
               if (ep->ex) (ep->f)(pi, g, r->tick, ep->user);
               else        (ep->f)(pi, g, r->tick);
            }
            ep = ep->next;
         }
      }
   }
}